

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_p2sh_tests.cpp
# Opt level: O0

void __thiscall script_p2sh_tests::set::test_method(set *this)

{
  long lVar1;
  __normal_iterator<CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_> __first;
  __normal_iterator<CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_> __first_00;
  __normal_iterator<CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_> __first_01;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  long in_FS_OFFSET;
  SignatureData *in_stack_ffffffffffffeeb8;
  undefined7 in_stack_ffffffffffffeec0;
  undefined1 in_stack_ffffffffffffeec7;
  assertion_result *in_stack_ffffffffffffeec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeed0;
  CTransaction *in_stack_ffffffffffffeed8;
  undefined7 in_stack_ffffffffffffeee0;
  undefined1 in_stack_ffffffffffffeee7;
  SignatureData *in_stack_ffffffffffffeee8;
  int in_stack_ffffffffffffeef0;
  uint in_stack_ffffffffffffeef4;
  CTransaction *in_stack_ffffffffffffeef8;
  __normal_iterator<CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>
  in_stack_ffffffffffffef00;
  undefined4 in_stack_ffffffffffffef08;
  int in_stack_ffffffffffffef0c;
  CScript *in_stack_ffffffffffffef10;
  FillableSigningProvider *in_stack_ffffffffffffef18;
  FillableSigningProvider *local_10c8;
  SignatureData *in_stack_ffffffffffffef48;
  CScript *pCVar5;
  CScript *local_10b0;
  CScript *local_1098;
  CMutableTransaction *local_1080;
  CMutableTransaction *local_fd8;
  CScript *local_f70;
  CScript *local_f08;
  CKey *local_ec8;
  bool no_pbms_is_std;
  int i_3;
  int i_2;
  int i_1;
  int i;
  set *this_local;
  const_string local_e68;
  lazy_ostream local_e58 [2];
  assertion_result local_e38 [2];
  const_string local_e00;
  lazy_ostream local_df0 [2];
  assertion_result local_dd0 [2];
  const_string local_d98;
  lazy_ostream local_d88 [2];
  assertion_result local_d68 [2];
  int i_4;
  const_string local_d28 [2];
  lazy_ostream local_d08 [2];
  assertion_result local_ce8 [2];
  CMutableTransaction txFrom;
  const_string local_c78 [2];
  lazy_ostream local_c58 [2];
  assertion_result local_c38 [2];
  CPubKey *local_bf8;
  CPubKey *local_bd0;
  CPubKey *local_ba8;
  const_string local_b88 [2];
  lazy_ostream local_b68 [2];
  assertion_result local_b48 [2];
  vector<CPubKey,_std::allocator<CPubKey>_> keys;
  SignatureData empty;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  CMutableTransaction txTo [4];
  CMutableTransaction aCStack_488 [2];
  string reason;
  CScript outer [4];
  CScript aCStack_2d8 [9];
  CScript inner [4];
  CScript aCStack_128 [2];
  CKey key [4];
  FillableSigningProvider keystore;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  FillableSigningProvider::FillableSigningProvider
            ((FillableSigningProvider *)in_stack_ffffffffffffeeb8);
  local_ec8 = key;
  do {
    CKey::CKey((CKey *)in_stack_ffffffffffffeeb8);
    local_ec8 = local_ec8 + 1;
  } while ((FillableSigningProvider *)local_ec8 != &keystore);
  std::vector<CPubKey,_std::allocator<CPubKey>_>::vector
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_ffffffffffffeeb8);
  std::vector<CPubKey,_std::allocator<CPubKey>_>::reserve
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_ffffffffffffeef8,
             CONCAT44(in_stack_ffffffffffffeef4,in_stack_ffffffffffffeef0));
  for (i = 0; i < 4; i = i + 1) {
    CKey::MakeNewKey((CKey *)in_stack_ffffffffffffeec8,(bool)in_stack_ffffffffffffeec7);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffeec8,
                 (pointer)CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0),
                 (unsigned_long)in_stack_ffffffffffffeeb8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffeeb8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffeef8,
                 (const_string *)CONCAT44(in_stack_ffffffffffffeef4,in_stack_ffffffffffffeef0),
                 (size_t)in_stack_ffffffffffffeee8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffeee7,in_stack_ffffffffffffeee0));
      FillableSigningProvider::AddKey
                ((FillableSigningProvider *)
                 CONCAT17(in_stack_ffffffffffffeee7,in_stack_ffffffffffffeee0),
                 (CKey *)in_stack_ffffffffffffeed8);
      boost::test_tools::assertion_result::assertion_result
                (in_stack_ffffffffffffeec8,(bool)in_stack_ffffffffffffeec7);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffeec8,
                 (pointer)CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0),
                 (unsigned_long)in_stack_ffffffffffffeeb8);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0),
                 (basic_cstring<const_char> *)in_stack_ffffffffffffeeb8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffeec8,
                 (pointer)CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0),
                 (unsigned_long)in_stack_ffffffffffffeeb8);
      in_stack_ffffffffffffeeb8 = (SignatureData *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_b48,local_b68,local_b88,0xab,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffeeb8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffeeb8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    CKey::GetPubKey((CKey *)CONCAT17(in_stack_ffffffffffffeee7,in_stack_ffffffffffffeee0));
    std::vector<CPubKey,_std::allocator<CPubKey>_>::push_back
              ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_ffffffffffffeeb8,
               (value_type *)0x9ee32b);
  }
  local_f08 = inner;
  do {
    CScript::CScript((CScript *)in_stack_ffffffffffffeeb8);
    local_f08 = local_f08 + 1;
  } while (local_f08 != aCStack_128);
  CKey::GetPubKey((CKey *)CONCAT17(in_stack_ffffffffffffeee7,in_stack_ffffffffffffeee0));
  PKHash::PKHash((PKHash *)in_stack_ffffffffffffeed0,(CPubKey *)in_stack_ffffffffffffeec8);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<PKHash,void,void,PKHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffeec8,
             (PKHash *)CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0));
  GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffeeb8);
  CScript::operator=((CScript *)in_stack_ffffffffffffeec8,
                     (CScript *)CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0));
  CScript::~CScript((CScript *)in_stack_ffffffffffffeeb8);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffeeb8);
  std::vector<CPubKey,_std::allocator<CPubKey>_>::begin
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)
             CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0));
  local_ba8 = (CPubKey *)
              std::vector<CPubKey,_std::allocator<CPubKey>_>::begin
                        ((vector<CPubKey,_std::allocator<CPubKey>_> *)
                         CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0));
  __gnu_cxx::__normal_iterator<CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>::
  operator+((__normal_iterator<CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_> *)
            in_stack_ffffffffffffeec8,CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0))
  ;
  std::allocator<CPubKey>::allocator((allocator<CPubKey> *)in_stack_ffffffffffffeeb8);
  __first._M_current._4_4_ = in_stack_ffffffffffffef0c;
  __first._M_current._0_4_ = in_stack_ffffffffffffef08;
  std::vector<CPubKey,std::allocator<CPubKey>>::
  vector<__gnu_cxx::__normal_iterator<CPubKey*,std::vector<CPubKey,std::allocator<CPubKey>>>,void>
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_ffffffffffffeee8,__first,
             in_stack_ffffffffffffef00,
             (allocator_type *)CONCAT17(in_stack_ffffffffffffeee7,in_stack_ffffffffffffeee0));
  GetScriptForMultisig
            (in_stack_ffffffffffffef0c,
             (vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_ffffffffffffef00._M_current);
  CScript::operator=((CScript *)in_stack_ffffffffffffeec8,
                     (CScript *)CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0));
  CScript::~CScript((CScript *)in_stack_ffffffffffffeeb8);
  std::vector<CPubKey,_std::allocator<CPubKey>_>::~vector
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_ffffffffffffeec8);
  std::allocator<CPubKey>::~allocator((allocator<CPubKey> *)in_stack_ffffffffffffeeb8);
  std::vector<CPubKey,_std::allocator<CPubKey>_>::begin
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)
             CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0));
  local_bd0 = (CPubKey *)
              std::vector<CPubKey,_std::allocator<CPubKey>_>::begin
                        ((vector<CPubKey,_std::allocator<CPubKey>_> *)
                         CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0));
  __gnu_cxx::__normal_iterator<CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>::
  operator+((__normal_iterator<CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_> *)
            in_stack_ffffffffffffeec8,CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0))
  ;
  std::allocator<CPubKey>::allocator((allocator<CPubKey> *)in_stack_ffffffffffffeeb8);
  __first_00._M_current._4_4_ = in_stack_ffffffffffffef0c;
  __first_00._M_current._0_4_ = in_stack_ffffffffffffef08;
  std::vector<CPubKey,std::allocator<CPubKey>>::
  vector<__gnu_cxx::__normal_iterator<CPubKey*,std::vector<CPubKey,std::allocator<CPubKey>>>,void>
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_ffffffffffffeee8,__first_00,
             in_stack_ffffffffffffef00,
             (allocator_type *)CONCAT17(in_stack_ffffffffffffeee7,in_stack_ffffffffffffeee0));
  GetScriptForMultisig
            (in_stack_ffffffffffffef0c,
             (vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_ffffffffffffef00._M_current);
  CScript::operator=((CScript *)in_stack_ffffffffffffeec8,
                     (CScript *)CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0));
  CScript::~CScript((CScript *)in_stack_ffffffffffffeeb8);
  std::vector<CPubKey,_std::allocator<CPubKey>_>::~vector
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_ffffffffffffeec8);
  std::allocator<CPubKey>::~allocator((allocator<CPubKey> *)in_stack_ffffffffffffeeb8);
  std::vector<CPubKey,_std::allocator<CPubKey>_>::begin
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)
             CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0));
  local_bf8 = (CPubKey *)
              std::vector<CPubKey,_std::allocator<CPubKey>_>::begin
                        ((vector<CPubKey,_std::allocator<CPubKey>_> *)
                         CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0));
  __gnu_cxx::__normal_iterator<CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_>::
  operator+((__normal_iterator<CPubKey_*,_std::vector<CPubKey,_std::allocator<CPubKey>_>_> *)
            in_stack_ffffffffffffeec8,CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0))
  ;
  std::allocator<CPubKey>::allocator((allocator<CPubKey> *)in_stack_ffffffffffffeeb8);
  __first_01._M_current._4_4_ = in_stack_ffffffffffffef0c;
  __first_01._M_current._0_4_ = in_stack_ffffffffffffef08;
  std::vector<CPubKey,std::allocator<CPubKey>>::
  vector<__gnu_cxx::__normal_iterator<CPubKey*,std::vector<CPubKey,std::allocator<CPubKey>>>,void>
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_ffffffffffffeee8,__first_01,
             in_stack_ffffffffffffef00,
             (allocator_type *)CONCAT17(in_stack_ffffffffffffeee7,in_stack_ffffffffffffeee0));
  GetScriptForMultisig
            (in_stack_ffffffffffffef0c,
             (vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_ffffffffffffef00._M_current);
  CScript::operator=((CScript *)in_stack_ffffffffffffeec8,
                     (CScript *)CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0));
  CScript::~CScript((CScript *)in_stack_ffffffffffffeeb8);
  std::vector<CPubKey,_std::allocator<CPubKey>_>::~vector
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_ffffffffffffeec8);
  std::allocator<CPubKey>::~allocator((allocator<CPubKey> *)in_stack_ffffffffffffeeb8);
  local_f70 = outer;
  do {
    CScript::CScript((CScript *)in_stack_ffffffffffffeeb8);
    local_f70 = local_f70 + 1;
  } while (local_f70 != aCStack_2d8);
  for (i_1 = 0; i_1 < 4; i_1 = i_1 + 1) {
    ScriptHash::ScriptHash
              ((ScriptHash *)in_stack_ffffffffffffeed0,(CScript *)in_stack_ffffffffffffeec8);
    std::
    variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
    ::variant<ScriptHash,void,void,ScriptHash,void>
              ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                *)in_stack_ffffffffffffeec8,
               (ScriptHash *)CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0));
    GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffeeb8);
    CScript::operator=((CScript *)in_stack_ffffffffffffeec8,
                       (CScript *)CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0));
    CScript::~CScript((CScript *)in_stack_ffffffffffffeeb8);
    std::
    variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                *)in_stack_ffffffffffffeeb8);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffeec8,
                 (pointer)CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0),
                 (unsigned_long)in_stack_ffffffffffffeeb8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffeeb8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffeef8,
                 (const_string *)CONCAT44(in_stack_ffffffffffffeef4,in_stack_ffffffffffffeef0),
                 (size_t)in_stack_ffffffffffffeee8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffeee7,in_stack_ffffffffffffeee0));
      FillableSigningProvider::AddCScript(in_stack_ffffffffffffef18,in_stack_ffffffffffffef10);
      boost::test_tools::assertion_result::assertion_result
                (in_stack_ffffffffffffeec8,(bool)in_stack_ffffffffffffeec7);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffeec8,
                 (pointer)CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0),
                 (unsigned_long)in_stack_ffffffffffffeeb8);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0),
                 (basic_cstring<const_char> *)in_stack_ffffffffffffeeb8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffeec8,
                 (pointer)CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0),
                 (unsigned_long)in_stack_ffffffffffffeeb8);
      in_stack_ffffffffffffeeb8 = (SignatureData *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_c38,local_c58,local_c78,0xb9,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffeeb8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffeeb8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffeeb8);
  std::__cxx11::string::string(in_stack_ffffffffffffeed0);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffeed8,
             (size_type)in_stack_ffffffffffffeed0);
  for (i_2 = 0; i_2 < 4; i_2 = i_2 + 1) {
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffeec8,
               CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0));
    CScript::operator=((CScript *)in_stack_ffffffffffffeec8,
                       (CScript *)CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0));
    pvVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                       ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffeec8,
                        CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0));
    pvVar3->nValue = 1000000;
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeec8,
               (pointer)CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0),
               (unsigned_long)in_stack_ffffffffffffeeb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeeb8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeef8,
               (const_string *)CONCAT44(in_stack_ffffffffffffeef4,in_stack_ffffffffffffeef0),
               (size_t)in_stack_ffffffffffffeee8,
               (const_string *)CONCAT17(in_stack_ffffffffffffeee7,in_stack_ffffffffffffeee0));
    CTransaction::CTransaction
              (in_stack_ffffffffffffeef8,
               (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffeef4,in_stack_ffffffffffffeef0))
    ;
    IsStandardTx(in_stack_ffffffffffffeed8,in_stack_ffffffffffffeed0);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_ffffffffffffeec8,(bool)in_stack_ffffffffffffeec7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeec8,
               (pointer)CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0),
               (unsigned_long)in_stack_ffffffffffffeeb8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0),
               (basic_cstring<const_char> *)in_stack_ffffffffffffeeb8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeec8,
               (pointer)CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0),
               (unsigned_long)in_stack_ffffffffffffeeb8);
    in_stack_ffffffffffffeeb8 = (SignatureData *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_ce8,local_d08,local_d28,0xc4,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffeeb8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffeeb8);
    CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffeeb8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_fd8 = txTo;
  do {
    CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffeeb8);
    local_fd8 = local_fd8 + 1;
  } while (local_fd8 != aCStack_488);
  for (i_3 = 0; i_3 < 4; i_3 = i_3 + 1) {
    std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
              (&in_stack_ffffffffffffeed8->vin,(size_type)in_stack_ffffffffffffeed0);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffeed8,
               (size_type)in_stack_ffffffffffffeed0);
    pvVar4 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                       ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffeec8,
                        CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0));
    (pvVar4->prevout).n = i_3;
    CMutableTransaction::GetHash((CMutableTransaction *)in_stack_ffffffffffffeed8);
    pvVar4 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                       ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffeec8,
                        CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0));
    *(undefined8 *)((pvVar4->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
         local_578;
    *(undefined8 *)((pvVar4->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
         uStack_570;
    *(undefined8 *)(pvVar4->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
         local_588;
    *(undefined8 *)((pvVar4->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
         uStack_580;
    pvVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                       ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffeec8,
                        CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0));
    pvVar3->nValue = 1000000;
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffeec8,
               CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0));
    CScript::operator=((CScript *)in_stack_ffffffffffffeec8,
                       (CScript *)CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0));
  }
  for (i_4 = 0; i_4 < 4; i_4 = i_4 + 1) {
    SignatureData::SignatureData(in_stack_ffffffffffffef48);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffeec8,
                 (pointer)CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0),
                 (unsigned_long)in_stack_ffffffffffffeeb8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffeeb8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffeef8,
                 (const_string *)CONCAT44(in_stack_ffffffffffffeef4,in_stack_ffffffffffffeef0),
                 (size_t)in_stack_ffffffffffffeee8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffeee7,in_stack_ffffffffffffeee0));
      CTransaction::CTransaction
                (in_stack_ffffffffffffeef8,
                 (CMutableTransaction *)
                 CONCAT44(in_stack_ffffffffffffeef4,in_stack_ffffffffffffeef0));
      SignSignature((SigningProvider *)CONCAT44(in_stack_ffffffffffffef0c,in_stack_ffffffffffffef08)
                    ,(CTransaction *)in_stack_ffffffffffffef00._M_current,
                    (CMutableTransaction *)in_stack_ffffffffffffeef8,in_stack_ffffffffffffeef4,
                    in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8);
      boost::test_tools::assertion_result::assertion_result
                (in_stack_ffffffffffffeec8,(bool)in_stack_ffffffffffffeec7);
      boost::unit_test::lazy_ostream::instance();
      tinyformat::format<int>
                (&in_stack_ffffffffffffeee8->complete,
                 (int *)CONCAT17(in_stack_ffffffffffffeee7,in_stack_ffffffffffffeee0));
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffeec8,
                 (pointer)CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0),
                 (unsigned_long)in_stack_ffffffffffffeeb8);
      in_stack_ffffffffffffeeb8 = (SignatureData *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_d68,local_d88,&local_d98,0xd3,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)in_stack_ffffffffffffeeb8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffeeb8);
      CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffeeb8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffeec8,
                 (pointer)CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0),
                 (unsigned_long)in_stack_ffffffffffffeeb8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffeeb8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffeef8,
                 (const_string *)CONCAT44(in_stack_ffffffffffffeef4,in_stack_ffffffffffffeef0),
                 (size_t)in_stack_ffffffffffffeee8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffeee7,in_stack_ffffffffffffeee0));
      CTransaction::CTransaction
                (in_stack_ffffffffffffeef8,
                 (CMutableTransaction *)
                 CONCAT44(in_stack_ffffffffffffeef4,in_stack_ffffffffffffeef0));
      IsStandardTx((CTransaction *)in_stack_ffffffffffffeee8,(bool)in_stack_ffffffffffffeee7,
                   (string *)in_stack_ffffffffffffeed8);
      boost::test_tools::assertion_result::assertion_result
                (in_stack_ffffffffffffeec8,(bool)in_stack_ffffffffffffeec7);
      boost::unit_test::lazy_ostream::instance();
      tinyformat::format<int>
                (&in_stack_ffffffffffffeee8->complete,
                 (int *)CONCAT17(in_stack_ffffffffffffeee7,in_stack_ffffffffffffeee0));
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffeec8,
                 (pointer)CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0),
                 (unsigned_long)in_stack_ffffffffffffeeb8);
      in_stack_ffffffffffffeeb8 = (SignatureData *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_dd0,local_df0,&local_e00,0xd4,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)in_stack_ffffffffffffeeb8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffeeb8);
      CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffeeb8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    CTransaction::CTransaction
              (in_stack_ffffffffffffeef8,
               (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffeef4,in_stack_ffffffffffffeef0))
    ;
    IsStandardTx((CTransaction *)in_stack_ffffffffffffeee8,(bool)in_stack_ffffffffffffeee7,
                 (string *)in_stack_ffffffffffffeed8);
    CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffeeb8);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffeec8,
                 (pointer)CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0),
                 (unsigned_long)in_stack_ffffffffffffeeb8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffeeb8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffeef8,
                 (const_string *)CONCAT44(in_stack_ffffffffffffeef4,in_stack_ffffffffffffeef0),
                 (size_t)in_stack_ffffffffffffeee8,
                 (const_string *)CONCAT17(in_stack_ffffffffffffeee7,in_stack_ffffffffffffeee0));
      boost::test_tools::assertion_result::assertion_result
                (in_stack_ffffffffffffeec8,(bool)in_stack_ffffffffffffeec7);
      boost::unit_test::lazy_ostream::instance();
      tinyformat::format<int>
                (&in_stack_ffffffffffffeee8->complete,
                 (int *)CONCAT17(in_stack_ffffffffffffeee7,in_stack_ffffffffffffeee0));
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffeec8,
                 (pointer)CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0),
                 (unsigned_long)in_stack_ffffffffffffeeb8);
      in_stack_ffffffffffffeeb8 = (SignatureData *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_e38,local_e58,&local_e68,0xd6,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)in_stack_ffffffffffffeeb8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffeeb8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffeeb8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    SignatureData::~SignatureData(in_stack_ffffffffffffeeb8);
  }
  local_1080 = aCStack_488;
  do {
    local_1080 = local_1080 + -1;
    CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffeeb8);
  } while (local_1080 != txTo);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffeeb8);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffeeb8);
  local_1098 = aCStack_2d8;
  do {
    local_1098 = local_1098 + -1;
    CScript::~CScript((CScript *)in_stack_ffffffffffffeeb8);
  } while (local_1098 != outer);
  pCVar5 = inner;
  local_10b0 = aCStack_128;
  do {
    local_10b0 = local_10b0 + -1;
    CScript::~CScript((CScript *)in_stack_ffffffffffffeeb8);
  } while (local_10b0 != pCVar5);
  std::vector<CPubKey,_std::allocator<CPubKey>_>::~vector
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_ffffffffffffeec8);
  local_10c8 = &keystore;
  do {
    local_10c8 = (FillableSigningProvider *)
                 ((long)&local_10c8[-1].cs_KeyStore.super_recursive_mutex.
                         super___recursive_mutex_base._M_mutex + 0x18);
    CKey::~CKey((CKey *)in_stack_ffffffffffffeeb8);
  } while (local_10c8 != (FillableSigningProvider *)key);
  FillableSigningProvider::~FillableSigningProvider
            ((FillableSigningProvider *)in_stack_ffffffffffffeeb8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(set)
{
    // Test the CScript::Set* methods
    FillableSigningProvider keystore;
    CKey key[4];
    std::vector<CPubKey> keys;
    keys.reserve(4);
    for (int i = 0; i < 4; i++)
    {
        key[i].MakeNewKey(true);
        BOOST_CHECK(keystore.AddKey(key[i]));
        keys.push_back(key[i].GetPubKey());
    }

    CScript inner[4];
    inner[0] = GetScriptForDestination(PKHash(key[0].GetPubKey()));
    inner[1] = GetScriptForMultisig(2, std::vector<CPubKey>(keys.begin(), keys.begin()+2));
    inner[2] = GetScriptForMultisig(1, std::vector<CPubKey>(keys.begin(), keys.begin()+2));
    inner[3] = GetScriptForMultisig(2, std::vector<CPubKey>(keys.begin(), keys.begin()+3));

    CScript outer[4];
    for (int i = 0; i < 4; i++)
    {
        outer[i] = GetScriptForDestination(ScriptHash(inner[i]));
        BOOST_CHECK(keystore.AddCScript(inner[i]));
    }

    CMutableTransaction txFrom;  // Funding transaction:
    std::string reason;
    txFrom.vout.resize(4);
    for (int i = 0; i < 4; i++)
    {
        txFrom.vout[i].scriptPubKey = outer[i];
        txFrom.vout[i].nValue = CENT;
    }
    BOOST_CHECK(IsStandardTx(CTransaction(txFrom), reason));

    CMutableTransaction txTo[4]; // Spending transactions
    for (int i = 0; i < 4; i++)
    {
        txTo[i].vin.resize(1);
        txTo[i].vout.resize(1);
        txTo[i].vin[0].prevout.n = i;
        txTo[i].vin[0].prevout.hash = txFrom.GetHash();
        txTo[i].vout[0].nValue = 1*CENT;
        txTo[i].vout[0].scriptPubKey = inner[i];
    }
    for (int i = 0; i < 4; i++)
    {
        SignatureData empty;
        BOOST_CHECK_MESSAGE(SignSignature(keystore, CTransaction(txFrom), txTo[i], 0, SIGHASH_ALL, empty), strprintf("SignSignature %d", i));
        BOOST_CHECK_MESSAGE(IsStandardTx(CTransaction(txTo[i]), /*permit_bare_multisig=*/true, reason), strprintf("txTo[%d].IsStandard", i));
        bool no_pbms_is_std = IsStandardTx(CTransaction(txTo[i]), /*permit_bare_multisig=*/false, reason);
        BOOST_CHECK_MESSAGE((i == 0 ? no_pbms_is_std : !no_pbms_is_std), strprintf("txTo[%d].IsStandard(permbaremulti=false)", i));
    }
}